

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O1

void __thiscall incrementer<std::mutex>::operator()(incrementer<std::mutex> *this)

{
  int iVar1;
  int iVar2;
  unique_lock<std::mutex> ul;
  unique_lock<std::mutex> local_30;
  
  iVar2 = 5;
  do {
    local_30._M_device = this->mutex_;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    iVar1 = variable;
    local_30._M_owns = true;
    booster::ptime::millisleep(0x14);
    variable = iVar1 + 1;
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void operator()()
	{
		for(int i=0;i<5;i++) {
			{
				booster::unique_lock<MutexType> ul(*mutex_);
				int tmp = variable;
				booster::ptime::millisleep(20);
				variable = tmp + 1;
			}
		}
	}